

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall glu::TextureBuffer::upload(TextureBuffer *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))(0x8c2a,this->m_glBuffer);
  (**(code **)(lVar2 + 0x150))
            (0x8c2a,(long)(int)(this->m_refBuffer).m_cap,(this->m_refBuffer).m_ptr,0x88e4);
  (**(code **)(lVar2 + 0x40))(0x8c2a,0);
  err = (**(code **)(lVar2 + 0x800))();
  checkError(err,"Failed to upload buffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x3af);
  return;
}

Assistant:

void TextureBuffer::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	gl.bindBuffer(GL_TEXTURE_BUFFER, m_glBuffer);
	gl.bufferData(GL_TEXTURE_BUFFER, (glw::GLsizei)m_refBuffer.size(), m_refBuffer.getPtr(), GL_STATIC_DRAW);
	gl.bindBuffer(GL_TEXTURE_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload buffer");
}